

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O0

int MergeRopeChunksProc(size_t index,size_t length,size_t number,Col_RopeChunk *chunks,
                       Col_ClientData clientData)

{
  int iVar1;
  ulong uVar2;
  ulong local_48;
  size_t index_1;
  MergeRopeChunksInfo *info;
  Col_ClientData clientData_local;
  Col_RopeChunk *chunks_local;
  size_t number_local;
  size_t length_local;
  size_t index_local;
  
  if (*(long *)((long)clientData + 0x68) == 0) {
    *(Col_StringFormat *)clientData = chunks->format;
  }
  if ((*clientData == 0x11) || (*clientData == 0x12)) {
    if (chunks->format == *clientData) {
      if (*(long *)((long)clientData + 0x70) + chunks->byteLength < 0x5b) {
        memcpy((void *)((long)clientData + *(long *)((long)clientData + 0x70) + 4),chunks->data,
               chunks->byteLength);
        *(size_t *)((long)clientData + 0x68) = length + *(long *)((long)clientData + 0x68);
        *(size_t *)((long)clientData + 0x70) =
             chunks->byteLength + *(long *)((long)clientData + 0x70);
        index_local._4_4_ = 0;
      }
      else {
        index_local._4_4_ = -1;
      }
    }
    else {
      index_local._4_4_ = -1;
    }
  }
  else if ((chunks->format == COL_UTF8) || (chunks->format == COL_UTF16)) {
    index_local._4_4_ = -1;
  }
  else {
    if ((*clientData & (COL_UCS4|COL_UCS2|COL_UCS1)) <
        (chunks->format & (COL_UCS4|COL_UCS2|COL_UCS1))) {
      if (0x5c < (*(long *)((long)clientData + 0x68) + length) *
                 (ulong)(chunks->format & (COL_UCS4|COL_UCS2|COL_UCS1))) {
        return -1;
      }
    }
    else if (0x5c < *(long *)((long)clientData + 0x70) + length * (*clientData & 7)) {
      return -1;
    }
    iVar1 = *clientData;
    if (iVar1 == 1) {
      if (chunks->format == COL_UCS2) {
        uVar2 = *(long *)((long)clientData + 0x68);
        while (local_48 = uVar2 + -1, local_48 != -1) {
          *(short *)((long)clientData + local_48 * 2 + 4) =
               (short)*(char *)((long)clientData + uVar2 + 3);
          uVar2 = local_48;
        }
        *(long *)((long)clientData + 0x70) = *(long *)((long)clientData + 0x68) << 1;
        *(undefined4 *)clientData = 2;
      }
      else if (chunks->format == COL_UCS4) {
        uVar2 = *(long *)((long)clientData + 0x68);
        while (local_48 = uVar2 + -1, local_48 != -1) {
          *(int *)((long)clientData + local_48 * 4 + 4) =
               (int)*(char *)((long)clientData + uVar2 + 3);
          uVar2 = local_48;
        }
        *(long *)((long)clientData + 0x70) = *(long *)((long)clientData + 0x68) << 2;
        *(undefined4 *)clientData = 4;
      }
    }
    else if (iVar1 == 2) {
      if (chunks->format == COL_UCS1) {
        for (local_48 = 0; local_48 < length; local_48 = local_48 + 1) {
          *(ushort *)((long)clientData + local_48 * 2 + *(long *)((long)clientData + 0x70) + 4) =
               (ushort)*(byte *)((long)chunks->data + local_48);
        }
        *(size_t *)((long)clientData + 0x68) = length + *(long *)((long)clientData + 0x68);
        *(size_t *)((long)clientData + 0x70) = length * 2 + *(long *)((long)clientData + 0x70);
        return 0;
      }
      if (chunks->format == COL_UCS4) {
        local_48 = *(long *)((long)clientData + 0x68);
        while (local_48 = local_48 + -1, local_48 != -1) {
          *(uint *)((long)clientData + local_48 * 4 + 4) =
               (uint)*(ushort *)((long)clientData + local_48 * 2 + 4);
        }
        *(long *)((long)clientData + 0x70) = *(long *)((long)clientData + 0x68) << 2;
        *(undefined4 *)clientData = 4;
      }
    }
    else if (iVar1 == 4) {
      if (chunks->format == COL_UCS1) {
        for (local_48 = 0; local_48 < length; local_48 = local_48 + 1) {
          *(uint *)((long)clientData + local_48 * 4 + *(long *)((long)clientData + 0x70) + 4) =
               (uint)*(byte *)((long)chunks->data + local_48);
        }
        *(size_t *)((long)clientData + 0x68) = length + *(long *)((long)clientData + 0x68);
        *(size_t *)((long)clientData + 0x70) = length * 4 + *(long *)((long)clientData + 0x70);
        return 0;
      }
      if (chunks->format == COL_UCS2) {
        for (local_48 = 0; local_48 < length; local_48 = local_48 + 1) {
          *(uint *)((long)clientData + local_48 * 4 + *(long *)((long)clientData + 0x70) + 4) =
               (uint)*(ushort *)((long)chunks->data + local_48 * 2);
        }
        *(size_t *)((long)clientData + 0x68) = length + *(long *)((long)clientData + 0x68);
        *(size_t *)((long)clientData + 0x70) = length * 4 + *(long *)((long)clientData + 0x70);
        return 0;
      }
    }
    if (*(long *)((long)clientData + 0x70) + chunks->byteLength < 0x5d) {
      memcpy((void *)((long)clientData + *(long *)((long)clientData + 0x70) + 4),chunks->data,
             chunks->byteLength);
      *(size_t *)((long)clientData + 0x68) = length + *(long *)((long)clientData + 0x68);
      *(size_t *)((long)clientData + 0x70) = chunks->byteLength + *(long *)((long)clientData + 0x70)
      ;
      index_local._4_4_ = 0;
    }
    else {
      index_local._4_4_ = -1;
    }
  }
  return index_local._4_4_;
}

Assistant:

static int
MergeRopeChunksProc(
    size_t index,                   /*!< Rope-relative index where chunks
                                         begin. */
    size_t length,                  /*!< Length of chunks. */
    size_t number,                  /*!< Number of chunks. Always 1. */
    const Col_RopeChunk *chunks,    /*!< Array of chunks. First chunk never
                                         NULL. */

    /*! [in,out] Points to #MergeRopeChunksInfo. */
    Col_ClientData clientData)
{
    MergeRopeChunksInfo *info = (MergeRopeChunksInfo *) clientData;

    ASSERT(number == 1);
    if (info->length == 0) {
        info->format = chunks->format;
    }
    if (info->format == COL_UTF8 || info->format == COL_UTF16) {
        if (chunks->format != info->format) {
            /*
             * Don't merge UTF-8/16 with other formats.
             */

            return -1;
        }
        if (info->byteLength + chunks->byteLength
                > MAX_SHORT_LEAF_SIZE - UTFSTR_HEADER_SIZE) {
            /*
             * Data won't fit.
             */

            return -1;
        }

        /*
         * Append data.
         */

        memcpy(info->data+info->byteLength, chunks->data, chunks->byteLength);
        info->length += length;
        info->byteLength += chunks->byteLength;
        return 0;
    } else {
        size_t index;           /* For upconversions. */

        if (chunks->format == COL_UTF8 || chunks->format == COL_UTF16) {
            /*
             * Don't merge UTF-8/16 with fixed-width formats.
             */

            return -1;
        }

        /*
         * Convert and append data if needed. Conversion of existing data is
         * done in-place, so iterate backwards.
         */

        if (CHAR_WIDTH(info->format) >= CHAR_WIDTH(chunks->format)) {
            /*
             * Appended data will be upconverted.
             */

            if (info->byteLength + (length * CHAR_WIDTH(info->format))
                    > MAX_SHORT_LEAF_SIZE - UCSSTR_HEADER_SIZE) {
                /*
                 * Data won't fit.
                 */

                return -1;
            }
        } else {
            /*
             * Existing data will be upconverted.
             */

            if ((info->length + length) * CHAR_WIDTH(chunks->format)
                    > MAX_SHORT_LEAF_SIZE - UCSSTR_HEADER_SIZE) {
                /*
                 * Data won't fit.
                 */

                return -1;
            }
        }
        switch (info->format) {
        case COL_UCS1:
            switch (chunks->format) {
            case COL_UCS2:
                /*
                 * Upconvert existing data to UCS-2.
                 */

                for (index = info->length-1; index != -1; index--) {
                    ((Col_Char2 *) info->data)[index] = info->data[index];
                }
                info->byteLength = info->length*sizeof(Col_Char2);
                info->format = COL_UCS2;
                break;

            case COL_UCS4:
                /*
                 * Upconvert existing data to UCS-4.
                 */

                for (index = info->length-1; index != -1; index--) {
                    ((Col_Char4 *) info->data)[index] = info->data[index];
                }
                info->byteLength = info->length * sizeof(Col_Char4);
                info->format = COL_UCS4;
                break;
            }
            break;

        case COL_UCS2:
            switch (chunks->format) {
            case COL_UCS1:
                /*
                 * Append data and return, upconverting in the process.
                 */

                for (index = 0; index < length; index++) {
                    ((Col_Char2 *) (info->data+info->byteLength))[index]
                            = ((Col_Char1 *) chunks->data)[index];
                }
                info->length += length;
                info->byteLength += length*sizeof(Col_Char2);
                return 0;

            case COL_UCS4:
                /*
                 Upconvert existing data to UCS-4.
                 */

                for (index = info->length-1; index != -1; index--) {
                    ((Col_Char4 *) info->data)[index]
                            = ((Col_Char2 *) info->data)[index];
                }
                info->byteLength = info->length * sizeof(Col_Char4);
                info->format = COL_UCS4;
                break;
            }
            break;

        case COL_UCS4:
            switch (chunks->format) {
            case COL_UCS1:
                /*
                 * Append data and return, upconverting in the process.
                 */

                for (index = 0; index < length; index++) {
                    ((Col_Char4 *) (info->data+info->byteLength))[index]
                            = ((Col_Char1 *) chunks->data)[index];
                }
                info->length += length;
                info->byteLength += length*sizeof(Col_Char4);
                return 0;

            case COL_UCS2:
                /*
                 * Append data and return, upconverting in the process.
                 */

                for (index = 0; index < length; index++) {
                    ((Col_Char4 *) (info->data+info->byteLength))[index]
                            = ((Col_Char2 *) chunks->data)[index];
                }
                info->length += length;
                info->byteLength += length*sizeof(Col_Char4);
                return 0;
            }
            break;
        }

        ASSERT(info->format == chunks->format);

        if (info->byteLength + chunks->byteLength
                > MAX_SHORT_LEAF_SIZE - UCSSTR_HEADER_SIZE) {
            /*
             * Data won't fit.
             */

            return -1;
        }

        /*
         * Append data.
         */

        memcpy(info->data+info->byteLength, chunks->data, chunks->byteLength);
        info->length += length;
        info->byteLength += chunks->byteLength;
        return 0;
    }
}